

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_finish_decode
               (uchar *cbuffer,size_t cbufsize,uint w,uint h,LodePNGState *state,void *idat_in,
               size_t idatsize_in)

{
  LodePNGColorMode *b;
  LodePNGColorType colortype;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint extraout_EAX;
  ulong uVar5;
  uchar *tbuf;
  LodePNGColorMode *local_40;
  LodePNGColorMode *local_38;
  
  if (cbuffer == (uchar *)0x0 || cbufsize == 0) {
    state->error = 0x69;
    return 0x69;
  }
  uVar3 = (state->decoder).color_convert;
  if (uVar3 == 0) {
LAB_001e5c42:
    uVar3 = lodepng_color_mode_copy(&state->info_raw,&(state->info_png).color);
    state->error = uVar3;
    if (uVar3 != 0) {
      return uVar3;
    }
  }
  else {
    b = &(state->info_png).color;
    iVar2 = lodepng_color_mode_equal(&state->info_raw,b);
    if (iVar2 == 0) {
      local_40 = b;
      local_38 = &state->info_raw;
      uVar3 = inflateIdat(&tbuf,(uchar *)0x0,0,w,h,state,idat_in,idatsize_in);
      state->error = uVar3;
      colortype = (state->info_raw).colortype;
      if (((colortype | LCT_GREY_ALPHA) == LCT_RGBA) || ((state->info_raw).bitdepth == 8)) {
        uVar3 = (state->info_raw).bitdepth;
        uVar4 = getNumColorChannels(colortype);
        uVar5 = (ulong)(uVar4 * uVar3);
        if (cbufsize <
            (((uint)((ulong)h * (ulong)w) & 7) * uVar5 + 7 >> 3) +
            ((ulong)h * (ulong)w >> 3) * uVar5) {
          state->error = 0x7b;
          uVar3 = 0x7b;
          goto LAB_001e5d67;
        }
        uVar3 = lodepng_convert(cbuffer,tbuf,local_38,local_40,w,h);
        state->error = uVar3;
        free(tbuf);
        bVar1 = true;
        uVar3 = extraout_EAX;
      }
      else {
        uVar3 = 0x38;
LAB_001e5d67:
        bVar1 = false;
      }
      if (!bVar1) {
        return uVar3;
      }
      goto LAB_001e5d6d;
    }
    if (uVar3 == 0) goto LAB_001e5c42;
  }
  uVar3 = inflateIdat((uchar **)0x0,cbuffer,cbufsize,w,h,state,idat_in,idatsize_in);
  state->error = uVar3;
LAB_001e5d6d:
  return state->error;
}

Assistant:

unsigned lodepng_finish_decode(unsigned char* cbuffer, size_t cbufsize,
                               unsigned w, unsigned h,
                               LodePNGState* state, void* idat_in, size_t idatsize_in)
{
  if (!cbuffer || cbufsize == 0)
      CERROR_RETURN_ERROR(state->error, 105);  /*no destination specified*/

  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
    state->error = inflateIdat(NULL, cbuffer, cbufsize, w, h, state, idat_in, idatsize_in);
  } else {
    size_t outsize;
    unsigned char* tbuf;

    /*color conversion needed. Have lodepng_inflate_idat create a temporary buffer for the unconverted data*/
    state->error = inflateIdat(&tbuf, NULL, 0, w, h, state, idat_in, idatsize_in);
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
      && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }
    outsize = lodepng_get_raw_size(w, h, &state->info_raw);
    if(cbufsize < outsize) CERROR_RETURN_ERROR(state->error, 123); /* error: "destination buffer too small */
    state->error = lodepng_convert(cbuffer, tbuf, &state->info_raw,
                                   &state->info_png.color, w, h);
    lodepng_free(tbuf);
  }
  return state->error;
}